

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_btlazy2_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  uint uVar2;
  seqDef *psVar3;
  int iVar4;
  bool bVar5;
  undefined8 uVar6;
  ZSTD_matchState_t *pZVar7;
  seqStore_t *psVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  size_t sVar12;
  size_t sVar13;
  BYTE *pBVar14;
  BYTE *pBVar15;
  int *piVar16;
  U32 UVar17;
  BYTE *pBVar18;
  int *piVar19;
  long lVar20;
  U32 UVar21;
  size_t sVar22;
  uint uVar23;
  U32 UVar24;
  U32 UVar25;
  ulong uVar26;
  int *ip;
  size_t offsetFound;
  int *local_c8;
  int *local_c0;
  size_t local_a8;
  int *local_a0;
  BYTE *local_98;
  ulong local_90;
  BYTE *local_88;
  BYTE *local_80;
  int *local_78;
  U32 local_6c;
  int *local_68;
  ZSTD_matchState_t *local_60;
  ulong local_58;
  seqStore_t *local_50;
  int *local_48;
  U32 *local_40;
  BYTE *local_38;
  
  piVar19 = (int *)((long)src + srcSize);
  local_78 = (int *)((long)src + (srcSize - 8));
  local_80 = (ms->window).base;
  uVar2 = (ms->window).dictLimit;
  local_98 = local_80 + uVar2;
  UVar25 = *rep;
  UVar17 = rep[1];
  ip = (int *)((ulong)(local_98 == (BYTE *)src) + (long)src);
  local_c0 = (int *)src;
  local_40 = rep;
  if (ip < local_78) {
    local_88 = (ms->window).dictBase;
    local_58 = (ulong)(ms->window).lowLimit;
    local_68 = (int *)(local_88 + uVar2);
    local_38 = local_88 + local_58;
    iVar9 = uVar2 - 1;
    local_48 = piVar19 + -8;
    local_a0 = piVar19;
    local_60 = ms;
    local_50 = seqStore;
    do {
      pZVar7 = local_60;
      uVar10 = (int)ip - (int)local_80;
      local_90 = (ulong)uVar10;
      uVar10 = (uVar10 - UVar25) + 1;
      pBVar15 = local_80;
      if (uVar10 < uVar2) {
        pBVar15 = local_88;
      }
      local_6c = UVar17;
      if (((uint)local_58 < uVar10 && 2 < iVar9 - uVar10) &&
         (*(int *)((long)ip + 1) == *(int *)(pBVar15 + uVar10))) {
        piVar16 = piVar19;
        if (uVar10 < uVar2) {
          piVar16 = local_68;
        }
        sVar12 = ZSTD_count_2segments
                           ((BYTE *)((long)ip + 5),(BYTE *)((long)(pBVar15 + uVar10) + 4),
                            (BYTE *)piVar19,(BYTE *)piVar16,local_98);
        uVar26 = sVar12 + 4;
      }
      else {
        uVar26 = 0;
      }
      local_a8 = 999999999;
      sVar13 = ZSTD_BtFindBestMatch_extDict_selectMLS(pZVar7,(BYTE *)ip,(BYTE *)piVar19,&local_a8);
      sVar12 = uVar26;
      if (uVar26 < sVar13) {
        sVar12 = sVar13;
      }
      if (sVar12 < 4) {
        ip = (int *)((long)ip + ((long)ip - (long)local_c0 >> 8) + 1);
        UVar17 = local_6c;
      }
      else {
        local_c8 = ip;
        sVar22 = local_a8;
        if (sVar13 <= uVar26) {
          local_c8 = (int *)((long)ip + 1);
          sVar22 = 0;
        }
        uVar26 = local_90;
        if (ip < local_78) {
          do {
            piVar19 = (int *)((long)ip + 1);
            uVar10 = (int)uVar26 + 1;
            local_90 = uVar26;
            if (sVar22 == 0) {
              sVar22 = 0;
            }
            else {
              uVar11 = uVar10 - UVar25;
              pBVar15 = local_80;
              if (uVar11 < uVar2) {
                pBVar15 = local_88;
              }
              if (((uint)local_58 < uVar11 && 2 < iVar9 - uVar11) &&
                 (*piVar19 == *(int *)(pBVar15 + uVar11))) {
                piVar16 = local_a0;
                if (uVar11 < uVar2) {
                  piVar16 = local_68;
                }
                sVar13 = ZSTD_count_2segments
                                   ((BYTE *)((long)ip + 5),(BYTE *)((long)(pBVar15 + uVar11) + 4),
                                    (BYTE *)local_a0,(BYTE *)piVar16,local_98);
                uVar11 = (int)sVar22 + 1;
                if (uVar11 == 0) goto LAB_0012cb3d;
                if (sVar13 < 0xfffffffffffffffc) {
                  uVar23 = 0x1f;
                  if (uVar11 != 0) {
                    for (; uVar11 >> uVar23 == 0; uVar23 = uVar23 - 1) {
                    }
                  }
                  if ((int)((uVar23 ^ 0x1f) + (int)sVar12 * 3 + -0x1e) < (int)(sVar13 + 4) * 3) {
                    sVar22 = 0;
                    sVar12 = sVar13 + 4;
                    local_c8 = piVar19;
                  }
                }
              }
            }
            local_a8 = 999999999;
            sVar13 = ZSTD_BtFindBestMatch_extDict_selectMLS
                               (local_60,(BYTE *)piVar19,(BYTE *)local_a0,&local_a8);
            pZVar7 = local_60;
            uVar11 = (int)local_a8 + 1;
            if ((uVar11 == 0) || (uVar23 = (int)sVar22 + 1, uVar23 == 0)) {
LAB_0012cb3d:
              __assert_fail("val != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x12c2,"U32 ZSTD_highbit32(U32)");
            }
            bVar5 = true;
            if (3 < sVar13) {
              iVar4 = 0x1f;
              if (uVar11 != 0) {
                for (; uVar11 >> iVar4 == 0; iVar4 = iVar4 + -1) {
                }
              }
              uVar11 = 0x1f;
              if (uVar23 != 0) {
                for (; uVar23 >> uVar11 == 0; uVar11 = uVar11 - 1) {
                }
              }
              if ((int)((uVar11 ^ 0x1f) + (int)sVar12 * 4 + -0x1b) < (int)sVar13 * 4 - iVar4) {
                bVar5 = false;
                sVar12 = sVar13;
                sVar22 = local_a8;
                local_c8 = piVar19;
              }
            }
            if (bVar5) {
              if (local_78 <= piVar19) break;
              piVar19 = (int *)((long)ip + 2);
              uVar10 = (int)local_90 + 2;
              local_90 = (ulong)uVar10;
              if (sVar22 == 0) {
                sVar22 = 0;
              }
              else {
                uVar10 = uVar10 - UVar25;
                pBVar15 = local_80;
                if (uVar10 < uVar2) {
                  pBVar15 = local_88;
                }
                if (((uint)local_58 < uVar10 && 2 < iVar9 - uVar10) &&
                   (*piVar19 == *(int *)(pBVar15 + uVar10))) {
                  piVar16 = local_a0;
                  if (uVar10 < uVar2) {
                    piVar16 = local_68;
                  }
                  sVar13 = ZSTD_count_2segments
                                     ((BYTE *)((long)ip + 6),(BYTE *)((long)(pBVar15 + uVar10) + 4),
                                      (BYTE *)local_a0,(BYTE *)piVar16,local_98);
                  uVar10 = (int)sVar22 + 1;
                  if (uVar10 == 0) goto LAB_0012cb3d;
                  if (sVar13 < 0xfffffffffffffffc) {
                    uVar11 = 0x1f;
                    if (uVar10 != 0) {
                      for (; uVar10 >> uVar11 == 0; uVar11 = uVar11 - 1) {
                      }
                    }
                    if ((int)((uVar11 ^ 0x1f) + (int)sVar12 * 4 + -0x1e) < (int)(sVar13 + 4) * 4) {
                      sVar22 = 0;
                      sVar12 = sVar13 + 4;
                      local_c8 = piVar19;
                    }
                  }
                }
              }
              local_a8 = 999999999;
              sVar13 = ZSTD_BtFindBestMatch_extDict_selectMLS
                                 (pZVar7,(BYTE *)piVar19,(BYTE *)local_a0,&local_a8);
              uVar10 = (int)local_a8 + 1;
              if ((uVar10 == 0) || (uVar11 = (int)sVar22 + 1, uVar11 == 0)) goto LAB_0012cb3d;
              bVar5 = true;
              if (3 < sVar13) {
                iVar4 = 0x1f;
                if (uVar10 != 0) {
                  for (; uVar10 >> iVar4 == 0; iVar4 = iVar4 + -1) {
                  }
                }
                uVar10 = 0x1f;
                if (uVar11 != 0) {
                  for (; uVar11 >> uVar10 == 0; uVar10 = uVar10 - 1) {
                  }
                }
                if ((int)((uVar10 ^ 0x1f) + (int)sVar12 * 4 + -0x18) < (int)sVar13 * 4 - iVar4) {
                  bVar5 = false;
                  sVar12 = sVar13;
                  sVar22 = local_a8;
                  local_c8 = piVar19;
                }
              }
              uVar26 = local_90;
              if (bVar5) break;
            }
            else {
              uVar26 = (ulong)uVar10;
            }
            ip = piVar19;
          } while (piVar19 < local_78);
        }
        if (sVar22 == 0) {
          UVar21 = 1;
          UVar24 = UVar25;
          UVar17 = local_6c;
        }
        else {
          pBVar18 = (BYTE *)((long)local_c8 + (2 - (long)(local_80 + sVar22)));
          pBVar14 = local_98;
          pBVar15 = local_80;
          if ((uint)pBVar18 < uVar2) {
            pBVar14 = local_38;
            pBVar15 = local_88;
          }
          if ((local_c0 < local_c8) &&
             (uVar26 = (ulong)pBVar18 & 0xffffffff, pBVar14 < pBVar15 + uVar26)) {
            pBVar15 = pBVar15 + uVar26;
            do {
              piVar19 = (int *)((long)local_c8 + -1);
              pBVar15 = pBVar15 + -1;
              if ((*(BYTE *)piVar19 != *pBVar15) ||
                 (sVar12 = sVar12 + 1, local_c8 = piVar19, piVar19 <= local_c0)) break;
            } while (pBVar14 < pBVar15);
          }
          UVar21 = (int)sVar22 + 1;
          UVar24 = (int)sVar22 - 2;
          UVar17 = UVar25;
        }
        if (local_50->maxNbSeq <=
            (ulong)((long)local_50->sequences - (long)local_50->sequencesStart >> 3)) {
LAB_0012cb5c:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_50->maxNbLit) {
LAB_0012cb7b:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203a,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar26 = (long)local_c8 - (long)local_c0;
        pBVar15 = local_50->lit;
        if (local_50->litStart + local_50->maxNbLit < pBVar15 + uVar26) {
LAB_0012cbb9:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_a0 < local_c8) {
LAB_0012cb9a:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203c,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_48 < local_c8) {
          ZSTD_safecopyLiterals(pBVar15,(BYTE *)local_c0,(BYTE *)local_c8,(BYTE *)local_48);
        }
        else {
          uVar6 = *(undefined8 *)(local_c0 + 2);
          *(undefined8 *)pBVar15 = *(undefined8 *)local_c0;
          *(undefined8 *)(pBVar15 + 8) = uVar6;
          if (0x10 < uVar26) {
            pBVar14 = local_50->lit;
            pBVar15 = pBVar14 + 0x10;
            piVar19 = local_c0 + 4;
            if ((BYTE *)0xffffffffffffffe8 < pBVar15 + (-8 - (long)piVar19)) {
              __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1268,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            if ((BYTE *)0xffffffffffffffe0 < pBVar15 + (-0x10 - (long)piVar19)) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar6 = *(undefined8 *)(local_c0 + 6);
            *(undefined8 *)pBVar15 = *(undefined8 *)piVar19;
            *(undefined8 *)(pBVar14 + 0x18) = uVar6;
            if (0x20 < (long)uVar26) {
              lVar20 = 0;
              do {
                puVar1 = (undefined8 *)((long)local_c0 + lVar20 + 0x20);
                uVar6 = puVar1[1];
                pBVar15 = pBVar14 + lVar20 + 0x20;
                *(undefined8 *)pBVar15 = *puVar1;
                *(undefined8 *)(pBVar15 + 8) = uVar6;
                puVar1 = (undefined8 *)((long)local_c0 + lVar20 + 0x30);
                uVar6 = puVar1[1];
                *(undefined8 *)(pBVar15 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar15 + 0x18) = uVar6;
                lVar20 = lVar20 + 0x20;
              } while (pBVar15 + 0x20 < pBVar14 + uVar26);
            }
          }
        }
        psVar8 = local_50;
        piVar19 = local_a0;
        local_50->lit = local_50->lit + uVar26;
        if (0xffff < uVar26) {
          if (local_50->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x204d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_50->longLengthID = 1;
          local_50->longLengthPos =
               (U32)((ulong)((long)local_50->sequences - (long)local_50->sequencesStart) >> 3);
        }
        psVar3 = local_50->sequences;
        psVar3->litLength = (U16)uVar26;
        psVar3->offset = UVar21;
        if (0xffff < sVar12 - 3) {
          if (local_50->longLengthID != 0) {
LAB_0012cbd8:
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2058,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_50->longLengthID = 2;
          local_50->longLengthPos =
               (U32)((ulong)((long)psVar3 - (long)local_50->sequencesStart) >> 3);
        }
        psVar3->matchLength = (U16)(sVar12 - 3);
        local_50->sequences = psVar3 + 1;
        ip = (int *)((long)local_c8 + sVar12);
        local_c0 = ip;
        do {
          UVar25 = UVar24;
          if (local_78 < ip) break;
          uVar10 = (uint)((long)ip - (long)(local_80 + UVar17));
          pBVar15 = local_80;
          if (uVar10 < uVar2) {
            pBVar15 = local_88;
          }
          if (((uint)local_58 < uVar10 && 2 < iVar9 - uVar10) &&
             (*ip == *(int *)(pBVar15 + ((long)ip - (long)(local_80 + UVar17) & 0xffffffff)))) {
            piVar16 = piVar19;
            if (uVar10 < uVar2) {
              piVar16 = local_68;
            }
            sVar12 = ZSTD_count_2segments
                               ((BYTE *)(ip + 1),
                                (BYTE *)((long)(pBVar15 +
                                               ((long)ip - (long)(local_80 + UVar17) & 0xffffffff))
                                        + 4),(BYTE *)piVar19,(BYTE *)piVar16,local_98);
            if (psVar8->maxNbSeq <=
                (ulong)((long)psVar8->sequences - (long)psVar8->sequencesStart >> 3))
            goto LAB_0012cb5c;
            if (0x20000 < psVar8->maxNbLit) goto LAB_0012cb7b;
            pBVar15 = psVar8->lit;
            if (psVar8->litStart + psVar8->maxNbLit < pBVar15) goto LAB_0012cbb9;
            if (piVar19 < local_c0) goto LAB_0012cb9a;
            if (local_48 < local_c0) {
              ZSTD_safecopyLiterals(pBVar15,(BYTE *)local_c0,(BYTE *)local_c0,(BYTE *)local_48);
            }
            else {
              uVar6 = *(undefined8 *)(local_c0 + 2);
              *(undefined8 *)pBVar15 = *(undefined8 *)local_c0;
              *(undefined8 *)(pBVar15 + 8) = uVar6;
            }
            psVar3 = psVar8->sequences;
            psVar3->litLength = 0;
            psVar3->offset = 1;
            if (0xffff < sVar12 + 1) {
              if (psVar8->longLengthID != 0) goto LAB_0012cbd8;
              psVar8->longLengthID = 2;
              psVar8->longLengthPos =
                   (U32)((ulong)((long)psVar3 - (long)psVar8->sequencesStart) >> 3);
            }
            psVar3->matchLength = (U16)(sVar12 + 1);
            psVar8->sequences = psVar3 + 1;
            ip = (int *)((long)ip + sVar12 + 4);
            bVar5 = true;
            UVar24 = UVar17;
            local_c0 = ip;
          }
          else {
            bVar5 = false;
            UVar25 = UVar17;
          }
          UVar17 = UVar25;
          UVar25 = UVar24;
        } while (bVar5);
      }
    } while (ip < local_78);
  }
  *local_40 = UVar25;
  local_40[1] = UVar17;
  return (long)piVar19 - (long)local_c0;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2);
}